

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void pnga_elem_multiply(Integer g_a,Integer g_b,Integer g_c)

{
  Integer chi [7];
  Integer clo [7];
  Integer bhi [7];
  Integer blo [7];
  Integer ahi [7];
  Integer alo [7];
  Integer cndim;
  Integer ctype;
  Integer bndim;
  Integer btype;
  Integer andim;
  Integer atype;
  Integer *in_stack_00000b38;
  Integer *in_stack_00000b40;
  Integer in_stack_00000b48;
  Integer *in_stack_00000b50;
  Integer *in_stack_00000b58;
  Integer in_stack_00000b60;
  Integer in_stack_00000b70;
  Integer *in_stack_00000b78;
  Integer *in_stack_00000b80;
  int in_stack_00000b88;
  undefined8 local_188 [16];
  undefined8 local_108 [16];
  undefined8 local_88 [8];
  long in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  long local_38;
  long local_28;
  
  pnga_inquire(chi[4],(Integer *)chi[3],(Integer *)chi[2],(Integer *)chi[1]);
  pnga_inquire(chi[4],(Integer *)chi[3],(Integer *)chi[2],(Integer *)chi[1]);
  pnga_inquire(chi[4],(Integer *)chi[3],(Integer *)chi[2],(Integer *)chi[1]);
  if ((local_28 != local_38) || (local_28 != in_stack_ffffffffffffffb8)) {
    pnga_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  for (; local_28 != 0; local_28 = local_28 + -1) {
    local_88[local_28 + -1] = 1;
    local_108[local_38 + -1] = 1;
    local_188[in_stack_ffffffffffffffb8 + -1] = 1;
    local_38 = local_38 + -1;
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + -1;
  }
  _ga_sync_begin = 1;
  ngai_elem2_patch_(in_stack_00000b60,in_stack_00000b58,in_stack_00000b50,in_stack_00000b48,
                    in_stack_00000b40,in_stack_00000b38,in_stack_00000b70,in_stack_00000b78,
                    in_stack_00000b80,in_stack_00000b88);
  return;
}

Assistant:

void pnga_elem_multiply(Integer g_a, Integer g_b, Integer g_c){
 
   Integer atype, andim;
   Integer btype, bndim;
   Integer ctype, cndim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer blo[MAXDIM],bhi[MAXDIM];
   Integer clo[MAXDIM],chi[MAXDIM];
 
    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    pnga_inquire(g_c,  &ctype, &cndim, chi);
    if((andim!=bndim)||(andim!=cndim))
	pnga_error("global arrays have different dimmensions.", andim);
    while(andim){
        alo[andim-1]=1;
        blo[bndim-1]=1;
        clo[cndim-1]=1;
        andim--;
        bndim--;
        cndim--;
    }
    _ga_sync_begin = 1; /*just to be on the safe side*/
    ngai_elem2_patch_(g_a, alo, ahi, g_b, blo, bhi,g_c,clo,chi,OP_ELEM_MULT);

}